

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O1

uint32_t icu_63::CollationFastLatin::getTertiaries
                   (uint32_t variableTop,UBool withCaseBits,uint32_t pair)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  
  if (pair < 0x10000) {
    if (pair < 0x1000) {
      if (variableTop < pair) {
        return (pair & 7) + (uint)(withCaseBits != '\0') * 8 + 0x20;
      }
      uVar2 = 0;
      if (pair < 0xc00) {
        uVar2 = pair;
      }
      return uVar2;
    }
    if (withCaseBits == '\0') {
      return (uint)(0x17f < (pair & 0x380)) * 0x200000 + (pair & 7) + 0x20;
    }
    uVar3 = pair & 0x1f;
    uVar1 = 0x20;
    if (0x17f < (pair & 0x380)) {
      uVar1 = 0x280020;
    }
  }
  else {
    if (0xfff < (pair & 0xffff)) {
      uVar1 = 0x1f001f;
      if (withCaseBits == '\0') {
        uVar1 = 0x70007;
      }
      return uVar1 & pair | 0x200020;
    }
    if ((pair & 0xffff) <= variableTop) {
      return 0;
    }
    uVar3 = pair & 0x70007;
    uVar1 = 0x280028;
    if (withCaseBits == '\0') {
      uVar1 = 0x200020;
    }
  }
  return uVar1 | uVar3;
}

Assistant:

uint32_t
CollationFastLatin::getTertiaries(uint32_t variableTop, UBool withCaseBits, uint32_t pair) {
    if(pair <= 0xffff) {
        // one mini CE
        if(pair >= MIN_SHORT) {
            // A high secondary weight means we really have two CEs,
            // a primary CE and a secondary CE.
            uint32_t ce = pair;
            if(withCaseBits) {
                pair = (pair & CASE_AND_TERTIARY_MASK) + TER_OFFSET;
                if((ce & SECONDARY_MASK) >= MIN_SEC_HIGH) {
                    pair |= (LOWER_CASE | COMMON_TER_PLUS_OFFSET) << 16;
                }
            } else {
                pair = (pair & TERTIARY_MASK) + TER_OFFSET;
                if((ce & SECONDARY_MASK) >= MIN_SEC_HIGH) {
                    pair |= COMMON_TER_PLUS_OFFSET << 16;
                }
            }
        } else if(pair > variableTop) {
            pair = (pair & TERTIARY_MASK) + TER_OFFSET;
            if(withCaseBits) {
                pair |= LOWER_CASE;
            }
        } else if(pair >= MIN_LONG) {
            pair = 0;  // variable
        }
        // else special mini CE
    } else {
        // two mini CEs, same primary groups, neither expands like above
        uint32_t ce = pair & 0xffff;
        if(ce >= MIN_SHORT) {
            if(withCaseBits) {
                pair &= TWO_CASES_MASK | TWO_TERTIARIES_MASK;
            } else {
                pair &= TWO_TERTIARIES_MASK;
            }
            pair += TWO_TER_OFFSETS;
        } else if(ce > variableTop) {
            pair = (pair & TWO_TERTIARIES_MASK) + TWO_TER_OFFSETS;
            if(withCaseBits) {
                pair |= TWO_LOWER_CASES;
            }
        } else {
            U_ASSERT(ce >= MIN_LONG);
            pair = 0;  // variable
        }
    }
    return pair;
}